

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::TuplePrefixPrinter<2ul>::PrintPrefixTo<std::tuple<cv::Mat,cv::Rect_<int>>>
               (tuple<cv::Mat,_cv::Rect_<int>_> *t,ostream *os)

{
  testing_internal::DefaultPrintNonContainerTo<cv::Mat>
            (&(t->super__Tuple_impl<0UL,_cv::Mat,_cv::Rect_<int>_>).
              super__Head_base<0UL,_cv::Mat,_false>._M_head_impl,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,", ",2);
  testing_internal::DefaultPrintNonContainerTo<cv::Rect_<int>>((Rect_<int> *)t,os);
  return;
}

Assistant:

static void PrintPrefixTo(const Tuple& t, ::std::ostream* os) {
    TuplePrefixPrinter<N - 1>::PrintPrefixTo(t, os);
    GTEST_INTENTIONAL_CONST_COND_PUSH_()
    if (N > 1) {
    GTEST_INTENTIONAL_CONST_COND_POP_()
      *os << ", ";
    }
    UniversalPrinter<
        typename TuplePolicy<Tuple>::template tuple_element<N - 1>::type>
        ::Print(TuplePolicy<Tuple>::template get<N - 1>(t), os);
  }